

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O2

void __thiscall
ON_BrepRegionTopology::ON_BrepRegionTopology(ON_BrepRegionTopology *this,ON_BrepRegionTopology *src)

{
  uint uVar1;
  ON_BrepFaceSide *pOVar2;
  ON_BrepRegion *pOVar3;
  ulong uVar4;
  ulong uVar5;
  
  ON_BrepFaceSideArray::ON_BrepFaceSideArray(&this->m_FS);
  ON_BrepRegionArray::ON_BrepRegionArray(&this->m_R);
  this->m_brep = (ON_Brep *)0x0;
  ON_ObjectArray<ON_BrepFaceSide>::operator=
            ((ON_ObjectArray<ON_BrepFaceSide> *)this,(ON_ObjectArray<ON_BrepFaceSide> *)src);
  ON_ObjectArray<ON_BrepRegion>::operator=
            (&(this->m_R).super_ON_ObjectArray<ON_BrepRegion>,
             &(src->m_R).super_ON_ObjectArray<ON_BrepRegion>);
  uVar1 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.super_ON_ClassArray<ON_BrepFaceSide>.
          m_count;
  pOVar2 = (this->m_FS).super_ON_ObjectArray<ON_BrepFaceSide>.super_ON_ClassArray<ON_BrepFaceSide>.
           m_a;
  uVar4 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x30 - uVar4 != 0; uVar4 = uVar4 + 0x30) {
    *(ON_BrepRegionTopology **)((long)&pOVar2->m_rtop + uVar4) = this;
  }
  uVar1 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.m_count
  ;
  pOVar3 = (this->m_R).super_ON_ObjectArray<ON_BrepRegion>.super_ON_ClassArray<ON_BrepRegion>.m_a;
  uVar4 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x78 - uVar4 != 0; uVar4 = uVar4 + 0x78) {
    *(ON_BrepRegionTopology **)((long)&pOVar3->m_rtop + uVar4) = this;
  }
  return;
}

Assistant:

ON_BrepRegionTopology::ON_BrepRegionTopology(const ON_BrepRegionTopology& src)
{
  int i;
  // do not copy m_brep
  m_brep = 0;
  m_FS = src.m_FS;
  m_R = src.m_R;
  for (i = 0; i < m_FS.Count(); i++ )
    m_FS[i].m_rtop = this;
  for (i = 0; i < m_R.Count(); i++ )
    m_R[i].m_rtop = this;
}